

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

SemaphoreWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
          (SemaphoreWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkSemaphoreCreateInfo *SemaphoreCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (SemaphoreCI->sType != VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[61]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SemaphoreCI.sType == VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO",
               (char (*) [61])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x168);
    std::__cxx11::string::~string((string *)&local_48);
  }
  CreateVulkanObject<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17,VkResult(*)(VkDevice_T*,VkSemaphoreCreateInfo_const*,VkAllocationCallbacks_const*,VkSemaphore_T**),VkSemaphoreCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkSemaphoreCreateInfo_ptr_VkAllocationCallbacks_ptr_VkSemaphore_T_ptr_ptr
              *)vkCreateSemaphore,SemaphoreCI,DebugName,"semaphore");
  return __return_storage_ptr__;
}

Assistant:

SemaphoreWrapper VulkanLogicalDevice::CreateSemaphore(const VkSemaphoreCreateInfo& SemaphoreCI, const char* DebugName) const
{
    VERIFY_EXPR(SemaphoreCI.sType == VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO);
    return CreateVulkanObject<VkSemaphore, VulkanHandleTypeId::Semaphore>(vkCreateSemaphore, SemaphoreCI, DebugName, "semaphore");
}